

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_win_get_buf(Nvim *this,Window window)

{
  allocator local_39;
  string local_38;
  Window local_18;
  Window window_local;
  Nvim *this_local;
  
  local_18 = window;
  window_local = (Window)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_win_get_buf",&local_39);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Nvim::async_win_get_buf(Window window) {
    client_.async_call("nvim_win_get_buf", window);
}